

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O1

bool __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::find_item_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t *slot_id,uint64_t quo)

{
  bool bVar1;
  uint64_t uVar2;
  ulong slot_id_00;
  
  do {
    uVar2 = get_quo_(this,*slot_id);
    if (uVar2 == quo) break;
    slot_id_00 = *slot_id + 1 & (this->capa_size_).mask_;
    *slot_id = slot_id_00;
    bVar1 = get_cbit_(this,slot_id_00);
  } while (!bVar1);
  return uVar2 == quo;
}

Assistant:

bool find_item_(uint64_t& slot_id, uint64_t quo) const {
        do {
            if (get_quo_(slot_id) == quo) {
                return true;
            }
            slot_id = right_(slot_id);
        } while (!get_cbit_(slot_id));
        return false;
    }